

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<unsigned_long_long,unsigned_long,5>::
     MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint64_t *t,uint64_t *u,unsigned_long_long *ret)

{
  undefined8 *in_RDX;
  uint64_t tmp;
  uint64_t u1;
  uint64_t t1;
  uint64_t *in_stack_ffffffffffffffc8;
  undefined8 uVar1;
  
  uVar1 = 0;
  LargeIntRegMultiply<unsigned_long,unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((uint64_t *)0x0,in_stack_ffffffffffffffc8,(uint64_t *)0x22afaa);
  *in_RDX = uVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow(const std::uint64_t& t, const std::uint64_t& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isUint64 && safeint_internal::int_traits<U>::isUint64, "T, U must be Uint64");
        std::uint64_t t1 = t;
        std::uint64_t u1 = u;
        std::uint64_t tmp = 0;
        LargeIntRegMultiply< std::uint64_t, std::uint64_t >::template RegMultiplyThrow< E >( t1, u1, &tmp );
        ret = tmp;
    }